

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PigLatinTranslator::separate_punctuation
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PigLatinTranslator *this,string *text)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_50 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,3,local_50);
  uVar2 = text->_M_string_length;
  if (uVar2 != 0) {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      bVar1 = is_punctuation(this,(text->_M_dataplus)._M_p[uVar4]);
      if (!bVar1) break;
      uVar2 = text->_M_string_length;
    }
    if (uVar4 != 0) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=
                ((string *)
                 (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
    uVar2 = text->_M_string_length;
    if (uVar2 != uVar4) {
      uVar4 = uVar2 & 0xffffffff;
      uVar2 = (long)((int)uVar2 + -1);
      do {
        uVar3 = uVar2;
        uVar4 = uVar4 - 1;
        if ((int)(uint)uVar4 < 1) break;
        bVar1 = is_punctuation(this,(text->_M_dataplus)._M_p[(uint)uVar4 & 0x7fffffff]);
        uVar2 = uVar3 - 1;
      } while (bVar1);
      if (uVar3 < text->_M_string_length) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)text);
        std::__cxx11::string::operator=
                  ((string *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 2),(string *)local_50);
        std::__cxx11::string::~string((string *)local_50);
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=
                ((string *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PigLatinTranslator::separate_punctuation(const std::string& text) const {
    std::vector<std::string> punct_sep_str(3);

    if( text.empty() ) {
        return punct_sep_str;
    }

    // Find beginning of the word
    int word_start = 0;
    while (word_start < text.size() && is_punctuation(text[word_start])) {
        word_start++;
    }

    // Store start punctuation
    if (word_start > 0) {
        punct_sep_str[0] = text.substr(0, word_start);
    }
    if (word_start == text.size()) {
        // Only punctuation
        return punct_sep_str;
    }

    // Find end of word
    int word_end = text.size() - 1;
    while (word_end > 0 && is_punctuation(text[word_end])) {
        word_end--;
    }

    // Store end punctuation
    if (word_end < text.size()) {
        punct_sep_str[2] = text.substr(word_end+1);
    }

    // Store word and return
    punct_sep_str[1] = text.substr(word_start, word_end - word_start + 1);
    return punct_sep_str;
}